

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  Kind kind;
  Kind KVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar2;
  int iVar3;
  LogicalExpr condition;
  NumericExpr else_expr;
  NumericExpr NVar4;
  NumericExpr NVar5;
  Impl *pIVar6;
  Reference RVar7;
  CountExpr CVar8;
  Expr arg0;
  int iVar9;
  Impl *impl;
  ulong uVar10;
  double dVar11;
  NumericArgHandler NVar12;
  VarArgHandler VVar13;
  PLTermHandler PVar14;
  SymbolicArgHandler SVar15;
  NumberOfArgHandler NVar16;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
  args;
  
  kind = OpCodeInfo::INFO[opcode].kind;
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case IF:
    condition = ReadLogicalExpr(this);
    NVar4 = ReadNumericExpr(this,false);
    else_expr = ReadNumericExpr(this,false);
    NVar5 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnIf
                      (this->handler_,(LogicalExpr)condition.super_ExprBase.impl_,
                       (NumericExpr)NVar4.super_ExprBase.impl_,
                       (NumericExpr)else_expr.super_ExprBase.impl_);
    return (NumericExpr)NVar5.super_ExprBase.impl_;
  case PLTERM:
    iVar3 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    if (iVar3 < 2) {
      BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x38275c);
    }
    iVar3 = iVar3 + -1;
    PVar14 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginPLTerm
                       (this->handler_,iVar3);
    uVar10 = PVar14._8_8_;
    pIVar6 = PVar14.impl_;
    iVar9 = 0;
    if (0 < iVar3) {
      iVar9 = iVar3;
    }
    while( true ) {
      dVar11 = ReadConstant(this);
      pIVar6->data[(int)uVar10 * 2] = dVar11;
      if (iVar9 == 0) break;
      dVar11 = ReadConstant(this);
      *(double *)((long)pIVar6->data + ((long)(int)(uVar10 >> 0x1f) << 3 | 8U)) = dVar11;
      uVar10 = (uVar10 & 0xffffffff00000000 | (ulong)((int)uVar10 + 1)) + 0x100000000;
      iVar9 = iVar9 + -1;
    }
    RVar7 = ReadReference(this);
    pIVar6->arg = (Impl *)RVar7.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase
                          .impl_;
    args.lhs.super_ExprBase.impl_ = (ExprBase)(ExprBase)pIVar6;
    break;
  case FIRST_ITERATED:
    iVar3 = ReadNumArgs(this,1);
    VVar13 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginVarArg
                       (this->handler_,kind,iVar3);
    args.lhs.super_ExprBase.impl_ = (ExprBase)VVar13.impl_;
    args.rhs.super_ExprBase.impl_._0_4_ = VVar13.arg_index_;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar3,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)&args);
    break;
  case SUM:
    iVar3 = ReadNumArgs(this,3);
    NVar12 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginSum
                       (this->handler_,iVar3);
    args.lhs.super_ExprBase.impl_ = (ExprBase)NVar12.impl_;
    args.rhs.super_ExprBase.impl_._0_4_ = NVar12.arg_index_;
    goto LAB_003357b4;
  case LAST_ITERATED:
    iVar3 = ReadNumArgs(this,1);
    pNVar2 = this->handler_;
    NVar4 = ReadNumericExpr(this,false);
    NVar16 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginNumberOf
                       (pNVar2,iVar3,(NumericExpr)NVar4.super_ExprBase.impl_);
    args.lhs.super_ExprBase.impl_ = (ExprBase)NVar16.impl_;
    args.rhs.super_ExprBase.impl_._0_4_ = NVar16.arg_index_;
    iVar3 = iVar3 + -1;
LAB_003357b4:
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar3,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>_>
                *)&args);
    break;
  case NUMBEROF_SYM:
    iVar3 = ReadNumArgs(this,1);
    pNVar2 = this->handler_;
    arg0 = ReadSymbolicExpr(this);
    SVar15 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
             BeginSymbolicNumberOf(pNVar2,iVar3,(Expr)arg0.super_ExprBase.impl_);
    args.lhs.super_ExprBase.impl_ = (ExprBase)SVar15.impl_;
    args.rhs.super_ExprBase.impl_._0_4_ = SVar15.arg_index_;
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::SymbolicExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)46,(mp::expr::Kind)46>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar3 + -1,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)46,_(mp::expr::Kind)46>_>
                *)&args);
    break;
  case COUNT:
    CVar8 = ReadCountExpr(this);
    return (NumericExpr)
           CVar8.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
  default:
    if (KVar1 == ADD) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
      ::BinaryArgReader(&args,this);
      NVar5.super_ExprBase.impl_._4_4_ = args.rhs.super_ExprBase.impl_._4_4_;
      NVar5.super_ExprBase.impl_._0_4_ = (int)args.rhs.super_ExprBase.impl_;
      NVar5 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBinary
                        (this->handler_,kind,(NumericExpr)args.lhs.super_ExprBase.impl_,NVar5);
      return (NumericExpr)(Impl *)NVar5.super_ExprBase.impl_;
    }
    if (KVar1 == FIRST_UNARY) {
      pNVar2 = this->handler_;
      NVar4 = ReadNumericExpr(this,false);
      NVar5 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnUnary
                        (pNVar2,kind,(NumericExpr)NVar4.super_ExprBase.impl_);
      return (NumericExpr)NVar5.super_ExprBase.impl_;
    }
  case CALL:
  case LAST_VARARG:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x382784);
    args.lhs.super_ExprBase.impl_ = (ExprBase)(ExprBase)(Impl *)0x0;
  }
  return (ExprBase)args.lhs.super_ExprBase.impl_;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}